

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O2

int GetCode(gif_source_ptr sinfo)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  j_compress_ptr pjVar4;
  jpeg_error_mgr *pjVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  iVar6 = sinfo->last_bit;
  iVar8 = sinfo->cur_bit;
  while( true ) {
    iVar9 = sinfo->code_size + iVar8;
    if (iVar9 <= iVar6) {
      lVar7 = (long)(iVar8 >> 3);
      bVar1 = sinfo->code_buf[lVar7 + 2];
      bVar2 = sinfo->code_buf[lVar7 + 1];
      bVar3 = sinfo->code_buf[lVar7];
      sinfo->cur_bit = iVar9;
      return ~(-1 << ((byte)sinfo->code_size & 0x1f)) &
             ((uint)bVar3 | (uint)bVar2 << 8 | (uint)bVar1 << 0x10) >> ((byte)iVar8 & 7);
    }
    if (sinfo->first_time != 0) {
      sinfo->first_time = 0;
      return sinfo->clear_code;
    }
    if (sinfo->out_of_blocks != 0) break;
    sinfo->code_buf[0] = sinfo->code_buf[(long)sinfo->last_byte + -2];
    sinfo->code_buf[1] = sinfo->code_buf[(long)sinfo->last_byte + -1];
    iVar6 = GetDataBlock(sinfo,sinfo->code_buf + 2);
    if (iVar6 == 0) {
      sinfo->out_of_blocks = 1;
      break;
    }
    iVar8 = (sinfo->cur_bit - sinfo->last_bit) + 0x10;
    sinfo->cur_bit = iVar8;
    sinfo->last_byte = iVar6 + 2;
    iVar6 = iVar6 * 8 + 0x10;
    sinfo->last_bit = iVar6;
  }
  pjVar4 = sinfo->cinfo;
  pjVar5 = pjVar4->err;
  pjVar5->msg_code = 0x403;
  (*pjVar5->emit_message)((j_common_ptr)pjVar4,-1);
  return sinfo->end_code;
}

Assistant:

LOCAL(int)
GetCode(gif_source_ptr sinfo)
/* Fetch the next code_size bits from the GIF data */
/* We assume code_size is less than 16 */
{
  register int accum;
  int offs, count;

  while (sinfo->cur_bit + sinfo->code_size > sinfo->last_bit) {
    /* Time to reload the buffer */
    /* First time, share code with Clear case */
    if (sinfo->first_time) {
      sinfo->first_time = FALSE;
      return sinfo->clear_code;
    }
    if (sinfo->out_of_blocks) {
      WARNMS(sinfo->cinfo, JWRN_GIF_NOMOREDATA);
      return sinfo->end_code;   /* fake something useful */
    }
    /* preserve last two bytes of what we have -- assume code_size <= 16 */
    sinfo->code_buf[0] = sinfo->code_buf[sinfo->last_byte-2];
    sinfo->code_buf[1] = sinfo->code_buf[sinfo->last_byte-1];
    /* Load more bytes; set flag if we reach the terminator block */
    if ((count = GetDataBlock(sinfo, &sinfo->code_buf[2])) == 0) {
      sinfo->out_of_blocks = TRUE;
      WARNMS(sinfo->cinfo, JWRN_GIF_NOMOREDATA);
      return sinfo->end_code;   /* fake something useful */
    }
    /* Reset counters */
    sinfo->cur_bit = (sinfo->cur_bit - sinfo->last_bit) + 16;
    sinfo->last_byte = 2 + count;
    sinfo->last_bit = sinfo->last_byte * 8;
  }

  /* Form up next 24 bits in accum */
  offs = sinfo->cur_bit >> 3;   /* byte containing cur_bit */
  accum = UCH(sinfo->code_buf[offs + 2]);
  accum <<= 8;
  accum |= UCH(sinfo->code_buf[offs + 1]);
  accum <<= 8;
  accum |= UCH(sinfo->code_buf[offs]);

  /* Right-align cur_bit in accum, then mask off desired number of bits */
  accum >>= (sinfo->cur_bit & 7);
  sinfo->cur_bit += sinfo->code_size;
  return accum & ((1 << sinfo->code_size) - 1);
}